

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

double gl4cts::Math::det4<double>
                 (double _00,double _10,double _20,double _30,double _01,double _11,double _21,
                 double _31,double _02,double _12,double _22,double _32,double _03,double _13,
                 double _23,double _33)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double _31_local;
  double _21_local;
  double _11_local;
  double _01_local;
  double _30_local;
  double _20_local;
  double _10_local;
  double _00_local;
  
  dVar1 = det3<double>(_11,_21,_31,_12,_22,_32,_13,_23,_33);
  dVar2 = det3<double>(_01,_21,_31,_02,_22,_32,_03,_23,_33);
  dVar3 = det3<double>(_01,_11,_31,_02,_12,_32,_03,_13,_33);
  dVar4 = det3<double>(_01,_11,_21,_02,_12,_22,_03,_13,_23);
  return -_30 * dVar4 + _20 * dVar3 + _00 * dVar1 + -(_10 * dVar2);
}

Assistant:

static T det4(T _00, T _10, T _20, T _30, T _01, T _11, T _21, T _31, T _02, T _12, T _22, T _32, T _03, T _13, T _23,
			  T _33)
{
	return _00 * det3(_11, _21, _31, _12, _22, _32, _13, _23, _33) -
		   _10 * det3(_01, _21, _31, _02, _22, _32, _03, _23, _33) +
		   _20 * det3(_01, _11, _31, _02, _12, _32, _03, _13, _33) -
		   _30 * det3(_01, _11, _21, _02, _12, _22, _03, _13, _23);
}